

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O0

int __thiscall basist::approx_move_to_front::init(approx_move_to_front *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  vector<int> *unaff_retaddr;
  
  uVar1 = (uint)ctx;
  basisu::vector<int>::resize(unaff_retaddr,(size_t)this,SUB81((ulong)ctx >> 0x18,0));
  this->m_rover = uVar1 >> 1;
  return (int)this;
}

Assistant:

void init(uint32_t n)
		{
			m_values.resize(n);
			m_rover = n / 2;
		}